

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_d7297f::PathSimplifier::Element::flip(Element *this)

{
  uint *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < (int)(((ushort)in_RDI[0xe] & 0xff) + 1) >> 1; iVar1 = iVar1 + 1) {
    qSwap<unsigned_int>((uint *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_RDI);
  }
  *(ushort *)(in_RDI + 0xe) =
       (ushort)in_RDI[0xe] & 0xfdff | (ushort)(((ushort)in_RDI[0xe] >> 9 & 1) == 0) << 9;
  return;
}

Assistant:

inline void PathSimplifier::Element::flip()
{
    for (int i = 0; i < (degree + 1) >> 1; ++i) {
        Q_ASSERT(degree >= Line && degree <= Cubic);
        Q_ASSERT(i >= 0 && i < degree);
        qSwap(indices[i], indices[degree - i]);
    }
    pointingUp = !pointingUp;
    Q_ASSERT(next == nullptr && previous == nullptr);
}